

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

Statement * __thiscall
slang::ast::StatementBlockSymbol::getStatement
          (StatementBlockSymbol *this,ASTContext *parentContext,StatementContext *stmtCtx)

{
  Compilation *compilation;
  Statement *pSVar1;
  anon_class_16_2_45074ed7_for_func local_b0;
  undefined1 local_a0 [8];
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_symbols_BlockSymbols_cpp:48:37)>
  guard;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> oldBlocks;
  Scope *local_70;
  undefined1 auStack_68 [8];
  ASTContext context;
  SyntaxNode *syntax;
  StatementContext *stmtCtx_local;
  ASTContext *parentContext_local;
  StatementBlockSymbol *this_local;
  
  if (this->stmt == (Statement *)0x0) {
    Scope::ensureElaborated(&this->super_Scope);
    if (this->stmt != (Statement *)0x0) {
      return this->stmt;
    }
    context.assertionInstance = (AssertionInstanceDetails *)Symbol::getSyntax(&this->super_Symbol);
    if ((context.assertionInstance == (AssertionInstanceDetails *)0x0) ||
       (*(SyntaxKind *)&(context.assertionInstance)->prevContext == RsRule)) {
      compilation = ASTContext::getCompilation(parentContext);
      pSVar1 = BlockStatement::makeEmpty(compilation);
      this->stmt = pSVar1;
    }
    else {
      context.randomizeDetails = (RandomizeDetails *)parentContext->assertionInstance;
      auStack_68 = (undefined1  [8])(parentContext->scope).ptr;
      context.scope.ptr = *(Scope **)&parentContext->lookupIndex;
      context._8_8_ = (parentContext->flags).m_bits;
      context.flags.m_bits = (underlying_type)parentContext->instanceOrProc;
      context.instanceOrProc = (Symbol *)parentContext->firstTempVar;
      context.firstTempVar = (TempVarSymbol *)parentContext->randomizeDetails;
      oldBlocks.size_ = (size_type)this;
      not_null<slang::ast::Scope_const*>::not_null<slang::ast::StatementBlockSymbol_const*,void>
                ((not_null<slang::ast::Scope_const*> *)&local_70,
                 (StatementBlockSymbol **)&oldBlocks.size_);
      auStack_68 = (undefined1  [8])local_70;
      context.scope.ptr._0_4_ = 0xffffffff;
      join_0x00000010_0x00000000_ =
           std::
           exchange<nonstd::span_lite::span<slang::ast::StatementBlockSymbol_const*const,18446744073709551615ul>,nonstd::span_lite::span<slang::ast::StatementBlockSymbol_const*const,18446744073709551615ul>const&>
                     (&stmtCtx->blocks,&this->blocks);
      local_b0.oldBlocks =
           (span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> *)
           &guard.valid;
      local_b0.stmtCtx = stmtCtx;
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/BlockSymbols.cpp:48:37)>
      ::ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_symbols_BlockSymbols_cpp:48:37)>
                    *)local_a0,&local_b0);
      pSVar1 = Statement::bindBlock
                         (this,(SyntaxNode *)context.assertionInstance,(ASTContext *)auStack_68,
                          stmtCtx);
      this->stmt = pSVar1;
      ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/BlockSymbols.cpp:48:37)>
      ::~ScopeGuard((ScopeGuard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Kuree[P]hgdb_rtl_extern_slang_source_ast_symbols_BlockSymbols_cpp:48:37)>
                     *)local_a0);
    }
  }
  return this->stmt;
}

Assistant:

const Statement& StatementBlockSymbol::getStatement(const ASTContext& parentContext,
                                                    Statement::StatementContext& stmtCtx) const {
    if (!stmt) {
        ensureElaborated();
        if (stmt)
            return *stmt;

        auto syntax = getSyntax();
        if (!syntax || syntax->kind == SyntaxKind::RsRule) {
            stmt = &BlockStatement::makeEmpty(parentContext.getCompilation());
        }
        else {
            ASTContext context = parentContext;
            context.scope = this;
            context.lookupIndex = SymbolIndex(UINT32_MAX);

            auto oldBlocks = std::exchange(stmtCtx.blocks, blocks);
            auto guard = ScopeGuard([&] { stmtCtx.blocks = oldBlocks; });

            stmt = &Statement::bindBlock(*this, *syntax, context, stmtCtx);
        }
    }
    return *stmt;
}